

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.cpp
# Opt level: O2

void duckdb::TemplatedGenerateSequence<short>
               (Vector *result,idx_t count,SelectionVector *sel,int64_t start,int64_t increment)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  InternalException *this;
  ulong uVar3;
  idx_t i;
  ulong uVar4;
  allocator local_51;
  string local_50;
  
  if ((start < 0x8000) && (increment < 0x8000)) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    psVar2 = sel->sel_vector;
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = uVar4;
      if (psVar2 != (sel_t *)0x0) {
        uVar3 = (ulong)psVar2[uVar4];
      }
      *(short *)(pdVar1 + uVar3 * 2) = (short)uVar3 * (short)increment + (short)start;
    }
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Sequence start or increment out of type range",&local_51);
  InternalException::InternalException(this,&local_50);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TemplatedGenerateSequence(Vector &result, idx_t count, const SelectionVector &sel, int64_t start,
                               int64_t increment) {
	D_ASSERT(result.GetType().IsNumeric());
	if (start > NumericLimits<T>::Maximum() || increment > NumericLimits<T>::Maximum()) {
		throw InternalException("Sequence start or increment out of type range");
	}
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<T>(result);
	auto value = static_cast<uint64_t>(start);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		result_data[idx] = static_cast<T>(value + static_cast<uint64_t>(increment) * idx);
	}
}